

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O2

bool soul::shouldShow(Function *f)

{
  Comment local_50;
  
  getComment(&local_50,&(f->super_ASTObject).context);
  SourceCodeUtilities::Comment::~Comment(&local_50);
  return local_50.isDoxygenStyle != false ||
         local_50.range.start.location.data != local_50.range.end.location.data &&
         local_50.range.start.sourceCode.object != (SourceCodeText *)0x0;
}

Assistant:

static bool shouldShow (const AST::Function& f)
{
    return shouldIncludeComment (getComment (f.context));
}